

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void __thiscall
brotli::ZopfliCostModel::SetFromLiteralCosts
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask)

{
  float fVar1;
  pointer mask;
  reference pvVar2;
  reference pvVar3;
  double dVar4;
  uint local_70;
  uint local_6c;
  uint32_t i_2;
  uint32_t i_1;
  size_t i;
  allocator<float> local_49;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> literal_cost;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  ZopfliCostModel *this_local;
  
  literal_cost.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)ringbuffer_mask;
  std::allocator<float>::allocator(&local_49);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_48,num_bytes + 1,&local_49);
  std::allocator<float>::~allocator(&local_49);
  mask = literal_cost.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_48,0);
  EstimateBitCostsForLiterals(position,num_bytes,(size_t)mask,ringbuffer,pvVar2);
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,num_bytes + 1);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->literal_costs_,0);
  *pvVar3 = 0.0;
  for (_i_2 = 0; _i_2 < num_bytes; _i_2 = _i_2 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->literal_costs_,_i_2);
    dVar4 = *pvVar3;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,_i_2);
    fVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->literal_costs_,_i_2 + 1);
    *pvVar3 = dVar4 + (double)fVar1;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_cmd_,0x2c0);
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_dist_,0x208);
  for (local_6c = 0; local_6c < 0x2c0; local_6c = local_6c + 1) {
    dVar4 = FastLog2((ulong)(local_6c + 0xb));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->cost_cmd_,(ulong)local_6c);
    *pvVar3 = dVar4;
  }
  for (local_70 = 0; local_70 < 0x208; local_70 = local_70 + 1) {
    dVar4 = FastLog2((ulong)(local_70 + 0x14));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->cost_dist_,(ulong)local_70);
    *pvVar3 = dVar4;
  }
  dVar4 = FastLog2(0xb);
  this->min_cost_cmd_ = dVar4;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  return;
}

Assistant:

void SetFromLiteralCosts(size_t num_bytes,
                           size_t position,
                           const uint8_t* ringbuffer,
                           size_t ringbuffer_mask) {
    std::vector<float> literal_cost(num_bytes + 1);
    EstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                ringbuffer, &literal_cost[0]);
    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] + literal_cost[i];
    }
    cost_cmd_.resize(kNumCommandPrefixes);
    cost_dist_.resize(kNumDistancePrefixes);
    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      cost_cmd_[i] = FastLog2(11 + i);
    }
    for (uint32_t i = 0; i < kNumDistancePrefixes; ++i) {
      cost_dist_[i] = FastLog2(20 + i);
    }
    min_cost_cmd_ = FastLog2(11);
  }